

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

bool IsFileInDir(string *infile,string *indir)

{
  string_view prefix;
  string_view str;
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  bool local_89;
  undefined1 local_58 [8];
  string dir;
  string file;
  string *indir_local;
  string *infile_local;
  
  cmsys::SystemTools::CollapseFullPath((string *)((long)&dir.field_2 + 8),infile);
  cmsys::SystemTools::CollapseFullPath((string *)local_58,indir);
  uVar2 = std::__cxx11::string::size();
  uVar3 = std::__cxx11::string::size();
  local_89 = false;
  if (uVar3 < uVar2) {
    str = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)(dir.field_2._M_local_buf + 8));
    prefix = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
    bVar1 = cmHasPrefix(str,prefix);
    local_89 = false;
    if (bVar1) {
      std::__cxx11::string::size();
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)((long)&dir.field_2 + 8));
      local_89 = *pcVar4 == '/';
    }
  }
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(dir.field_2._M_local_buf + 8));
  return local_89;
}

Assistant:

static bool IsFileInDir(const std::string& infile, const std::string& indir)
{
  std::string file = cmSystemTools::CollapseFullPath(infile);
  std::string dir = cmSystemTools::CollapseFullPath(indir);

  return file.size() > dir.size() && fnc_prefix(file, dir) &&
    file[dir.size()] == '/';
}